

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool __thiscall
picojson::default_parse_context::
parse_array_item<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (default_parse_context *this,
          input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in,size_t param_2)

{
  _Base_ptr *pp_Var1;
  string *this_00;
  _storage _Var2;
  bool bVar3;
  runtime_error *this_01;
  ulong uVar4;
  default_parse_context ctx;
  value local_28;
  
  if (this->out_->type_ != 4) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"\"type mismatch! call is<type>() before get<type>()\" && is<array>()");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (this->out_->u_).string_;
  local_28._0_8_ = local_28._0_8_ & 0xffffffff00000000;
  local_28.u_.number_ = 0.0;
  std::vector<picojson::value,_std::allocator<picojson::value>_>::emplace_back<picojson::value>
            ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00,&local_28);
  _Var2 = local_28.u_;
  if (local_28.type_ == 5) {
    if (local_28.u_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) goto LAB_00108d17;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                 *)local_28.u_.string_);
    uVar4 = 0x30;
  }
  else if (local_28.type_ == 4) {
    if (local_28.u_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0) goto LAB_00108d17;
    std::vector<picojson::value,_std::allocator<picojson::value>_>::~vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)local_28.u_.string_);
    uVar4 = 0x18;
  }
  else {
    if ((local_28.type_ != 3) ||
       (local_28.u_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
         *)0x0)) goto LAB_00108d17;
    pp_Var1 = &(((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  *)&(local_28.u_.array_)->
                     super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)->
               super__Rb_tree_header)._M_header._M_parent;
    if ((_Base_ptr *)
        *(undefined1 **)
         &(local_28.u_.array_)->
          super__Vector_base<picojson::value,_std::allocator<picojson::value>_> != pp_Var1) {
      operator_delete(*(undefined1 **)
                       &(local_28.u_.array_)->
                        super__Vector_base<picojson::value,_std::allocator<picojson::value>_>,
                      (ulong)((long)&(*pp_Var1)->_M_color + 1));
    }
    uVar4 = 0x20;
  }
  operator_delete(_Var2.string_,uVar4);
LAB_00108d17:
  local_28._0_8_ = (pointer)this_00->_M_string_length + -1;
  bVar3 = _parse<picojson::default_parse_context,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((default_parse_context *)&local_28,in);
  return bVar3;
}

Assistant:

bool parse_array_item(input<Iter> &in, size_t) {
    array &a = out_->get<array>();
    a.push_back(value());
    default_parse_context ctx(&a.back());
    return _parse(ctx, in);
  }